

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O2

int quicly_decrypt_address_token
              (ptls_aead_context_t *aead,quicly_address_token_plaintext_t *plaintext,void *_token,
              size_t len,size_t prefix_len,char **err_desc)

{
  in_addr_t *piVar1;
  byte *pbVar2;
  byte bVar3;
  st_ptls_aead_algorithm_t *psVar4;
  int iVar5;
  undefined8 uVar6;
  quicly_address_token_plaintext_t *pqVar7;
  int iVar8;
  char *pcVar9;
  size_t sVar10;
  anon_enum_32 aVar11;
  ulong uVar12;
  size_t sVar13;
  byte *pbVar14;
  byte *end;
  byte *local_500;
  uint16_t port;
  quicly_address_token_plaintext_t *local_4f0;
  uint8_t ptbuf [1200];
  
  *err_desc = (char *)0x0;
  psVar4 = aead->algo;
  uVar12 = psVar4->iv_size + prefix_len + 1 + psVar4->tag_size;
  if (len < uVar12) {
    pcVar9 = "token too small";
LAB_0011c424:
    *err_desc = pcVar9;
    return 0x32;
  }
  if (uVar12 + 0x4b0 < len) {
    pcVar9 = "token too large";
    goto LAB_0011c424;
  }
  bVar3 = *(byte *)((long)_token + prefix_len);
  aVar11 = (anon_enum_32)bVar3;
  if (bVar3 != 0) {
    if (bVar3 != 1) {
      pcVar9 = "unknown token type";
      goto LAB_0011c424;
    }
    aVar11 = QUICLY_ADDRESS_TOKEN_TYPE_RESUMPTION;
  }
  plaintext->type = aVar11;
  local_4f0 = plaintext;
  (*psVar4->setup_crypto)(aead,0,(void *)0x0,(void *)((long)_token + prefix_len + 1));
  sVar10 = aead->algo->iv_size;
  sVar13 = prefix_len + 1 + sVar10;
  sVar10 = (*aead->do_decrypt)(aead,ptbuf,(void *)((long)_token + sVar10 + prefix_len + 1),
                               len - sVar13,0,_token,sVar13);
  pqVar7 = local_4f0;
  if (sVar10 == 0xffffffffffffffff) {
    iVar8 = 0x33;
    pcVar9 = "token decryption failure";
  }
  else {
    end = ptbuf + sVar10;
    local_500 = ptbuf;
    iVar8 = ptls_decode64(&local_4f0->issued_at,&local_500,end);
    if ((iVar8 == 0) && (iVar5 = 0x32, iVar8 = iVar5, end != local_500)) {
      piVar1 = (in_addr_t *)(local_500 + 1);
      uVar12 = (ulong)*local_500;
      if (uVar12 <= (ulong)((long)end - (long)piVar1)) {
        if (uVar12 == 0x10) {
          (pqVar7->remote).sa.sa_family = 10;
          uVar6 = *(undefined8 *)(local_500 + 9);
          *(undefined8 *)((long)&pqVar7->remote + 8) = *(undefined8 *)piVar1;
          *(undefined8 *)((long)&pqVar7->remote + 0x10) = uVar6;
        }
        else {
          if (*local_500 != 4) goto LAB_0011c40e;
          (pqVar7->remote).sa.sa_family = 2;
          (pqVar7->remote).sin.sin_addr.s_addr = *piVar1;
        }
        local_500 = (byte *)((long)piVar1 + uVar12);
        iVar8 = ptls_decode16(&port,&local_500,end);
        if (iVar8 == 0) {
          (pqVar7->remote).sin.sin_port = port << 8 | port >> 8;
          if (pqVar7->type == QUICLY_ADDRESS_TOKEN_TYPE_RESUMPTION) {
            iVar8 = iVar5;
            if (end != local_500) {
              pbVar2 = local_500 + 1;
              uVar12 = (ulong)*local_500;
              if (uVar12 <= (ulong)((long)end - (long)pbVar2)) {
                pbVar14 = pbVar2 + uVar12;
                (pqVar7->field_4).resumption.len = uVar12;
                local_500 = pbVar2;
                memcpy(&pqVar7->field_4,pbVar2,uVar12);
LAB_0011c610:
                iVar8 = iVar5;
                if (end != pbVar14) {
                  local_500 = pbVar14 + 1;
                  uVar12 = (ulong)*pbVar14;
                  if (uVar12 <= (ulong)((long)end - (long)local_500)) {
                    pbVar2 = local_500 + uVar12;
                    (pqVar7->appdata).len = uVar12;
                    memcpy(&pqVar7->appdata,local_500,uVar12);
                    if (pbVar2 == end) {
                      return 0;
                    }
                  }
                }
              }
            }
          }
          else {
            if (pqVar7->type != QUICLY_ADDRESS_TOKEN_TYPE_RETRY) {
              __assert_fail("!\"unexpected token type\"",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                            ,0x185d,
                            "int quicly_decrypt_address_token(ptls_aead_context_t *, quicly_address_token_plaintext_t *, const void *, size_t, size_t, const char **)"
                           );
            }
            iVar8 = iVar5;
            if (end != local_500) {
              pbVar2 = local_500 + 1;
              bVar3 = *local_500;
              uVar12 = (ulong)bVar3;
              if ((uVar12 < 0x15) && (uVar12 <= (ulong)((long)end - (long)pbVar2))) {
                pbVar14 = pbVar2 + uVar12;
                local_500 = pbVar2;
                memcpy(&pqVar7->field_4,pbVar2,uVar12);
                (pqVar7->field_4).retry.original_dcid.len = bVar3;
                if (end != pbVar14) {
                  local_500 = pbVar14 + 1;
                  bVar3 = *pbVar14;
                  uVar12 = (ulong)bVar3;
                  if ((uVar12 < 0x15) && (uVar12 <= (ulong)((long)end - (long)local_500))) {
                    pbVar2 = local_500 + uVar12;
                    memcpy((void *)((long)&pqVar7->field_4 + 0x15),local_500,uVar12);
                    (local_4f0->field_4).retry.client_cid.len = bVar3;
                    if (end != pbVar2) {
                      local_500 = pbVar2 + 1;
                      bVar3 = *pbVar2;
                      uVar12 = (ulong)bVar3;
                      if ((uVar12 < 0x15) && (uVar12 <= (ulong)((long)end - (long)local_500))) {
                        pbVar14 = local_500 + uVar12;
                        memcpy((void *)((long)&pqVar7->field_4 + 0x2a),local_500,uVar12);
                        (local_4f0->field_4).retry.server_cid.len = bVar3;
                        goto LAB_0011c610;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
LAB_0011c40e:
    if (*err_desc != (char *)0x0) goto LAB_0011c44e;
    pcVar9 = "token decode error";
  }
  *err_desc = pcVar9;
LAB_0011c44e:
  if (pqVar7->type == QUICLY_ADDRESS_TOKEN_TYPE_RETRY) {
    return 0x2000b;
  }
  return iVar8;
}

Assistant:

int quicly_decrypt_address_token(ptls_aead_context_t *aead, quicly_address_token_plaintext_t *plaintext, const void *_token,
                                 size_t len, size_t prefix_len, const char **err_desc)
{
    const uint8_t *const token = _token;
    uint8_t ptbuf[QUICLY_MIN_CLIENT_INITIAL_SIZE];
    size_t ptlen;

    *err_desc = NULL;

    /* check if we can get type and decrypt */
    if (len < prefix_len + 1 + aead->algo->iv_size + aead->algo->tag_size) {
        *err_desc = "token too small";
        return PTLS_ALERT_DECODE_ERROR;
    }
    if (prefix_len + 1 + aead->algo->iv_size + sizeof(ptbuf) + aead->algo->tag_size < len) {
        *err_desc = "token too large";
        return PTLS_ALERT_DECODE_ERROR;
    }

    /* check type */
    switch (token[prefix_len]) {
    case QUICLY_ADDRESS_TOKEN_TYPE_RETRY:
        plaintext->type = QUICLY_ADDRESS_TOKEN_TYPE_RETRY;
        break;
    case QUICLY_ADDRESS_TOKEN_TYPE_RESUMPTION:
        plaintext->type = QUICLY_ADDRESS_TOKEN_TYPE_RESUMPTION;
        break;
    default:
        *err_desc = "unknown token type";
        return PTLS_ALERT_DECODE_ERROR;
    }

    /* `goto Exit` can only happen below this line, and that is guaranteed by declaring `ret` here */
    int ret;

    /* decrypt */
    aead->algo->setup_crypto(aead, 0, NULL, token + prefix_len + 1);
    if ((ptlen = ptls_aead_decrypt(aead, ptbuf, token + prefix_len + 1 + aead->algo->iv_size,
                                   len - (prefix_len + 1 + aead->algo->iv_size), 0, token, prefix_len + 1 + aead->algo->iv_size)) ==
        SIZE_MAX) {
        ret = PTLS_ALERT_DECRYPT_ERROR;
        *err_desc = "token decryption failure";
        goto Exit;
    }

    /* parse */
    const uint8_t *src = ptbuf, *end = src + ptlen;
    if ((ret = ptls_decode64(&plaintext->issued_at, &src, end)) != 0)
        goto Exit;
    {
        in_port_t *portaddr;
        ptls_decode_open_block(src, end, 1, {
            switch (end - src) {
            case 4: /* ipv4 */
                plaintext->remote.sin.sin_family = AF_INET;
                memcpy(&plaintext->remote.sin.sin_addr.s_addr, src, 4);
                portaddr = &plaintext->remote.sin.sin_port;
                break;
            case 16: /* ipv6 */
                plaintext->remote.sin6.sin6_family = AF_INET6;
                memcpy(&plaintext->remote.sin6.sin6_addr, src, 16);
                portaddr = &plaintext->remote.sin6.sin6_port;
                break;
            default:
                ret = PTLS_ALERT_DECODE_ERROR;
                goto Exit;
            }
            src = end;
        });
        uint16_t port;
        if ((ret = ptls_decode16(&port, &src, end)) != 0)
            goto Exit;
        *portaddr = htons(port);
    }
    switch (plaintext->type) {
    case QUICLY_ADDRESS_TOKEN_TYPE_RETRY:
#define DECODE_CID(field)                                                                                                          \
    do {                                                                                                                           \
        ptls_decode_open_block(src, end, 1, {                                                                                      \
            if (end - src > sizeof(plaintext->retry.field.cid)) {                                                                  \
                ret = PTLS_ALERT_DECODE_ERROR;                                                                                     \
                goto Exit;                                                                                                         \
            }                                                                                                                      \
            quicly_set_cid(&plaintext->retry.field, ptls_iovec_init(src, end - src));                                              \
            src = end;                                                                                                             \
        });                                                                                                                        \
    } while (0)
        DECODE_CID(original_dcid);
        DECODE_CID(client_cid);
        DECODE_CID(server_cid);
#undef DECODE_CID
        break;
    case QUICLY_ADDRESS_TOKEN_TYPE_RESUMPTION:
        ptls_decode_open_block(src, end, 1, {
            PTLS_BUILD_ASSERT(sizeof(plaintext->resumption.bytes) >= 256);
            plaintext->resumption.len = end - src;
            memcpy(plaintext->resumption.bytes, src, plaintext->resumption.len);
            src = end;
        });
        break;
    default:
        assert(!"unexpected token type");
        abort();
    }
    ptls_decode_block(src, end, 1, {
        PTLS_BUILD_ASSERT(sizeof(plaintext->appdata.bytes) >= 256);
        plaintext->appdata.len = end - src;
        memcpy(plaintext->appdata.bytes, src, plaintext->appdata.len);
        src = end;
    });
    ret = 0;

Exit:
    if (ret != 0) {
        if (*err_desc == NULL)
            *err_desc = "token decode error";
        /* promote the error to one that triggers the emission of INVALID_TOKEN_ERROR, if the token looked like a retry */
        if (plaintext->type == QUICLY_ADDRESS_TOKEN_TYPE_RETRY)
            ret = QUICLY_TRANSPORT_ERROR_INVALID_TOKEN;
    }
    return ret;
}